

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O2

int Gia_GlaCountNodes(Gia_Man_t *p,Vec_Int_t *vGla)

{
  int iVar1;
  Gia_Obj_t *pObj;
  int v;
  int iVar2;
  
  v = 0;
  iVar2 = 0;
  while( true ) {
    if (p->nObjs <= v) {
      return iVar2;
    }
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iVar1 = Gia_ObjId(p,pObj);
      iVar1 = Vec_IntEntry(vGla,iVar1);
      iVar2 = (iVar2 + 1) - (uint)(iVar1 == 0);
    }
    v = v + 1;
  }
  return iVar2;
}

Assistant:

int Gia_GlaCountNodes( Gia_Man_t * p, Vec_Int_t * vGla )
{
    Gia_Obj_t * pObj;
    int i, Count = 0;
    Gia_ManForEachAnd( p, pObj, i )
        if ( Vec_IntEntry(vGla, Gia_ObjId(p, pObj)) )
            Count++;
    return Count;
}